

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# GofRAngle.cpp
# Opt level: O0

void __thiscall
OpenMD::GofRAngle::GofRAngle
          (GofRAngle *this,SimInfo *info,string *filename,string *sele1,string *sele2,RealType len,
          int nrbins,int nangleBins)

{
  ostream *poVar1;
  StaticAnalyser *this_00;
  string *params_00;
  undefined8 *in_RDI;
  undefined8 in_XMM0_Qa;
  undefined4 in_stack_00000008;
  SimInfo *in_stack_00000018;
  SelectionManager *in_stack_00000020;
  string paramString;
  stringstream params;
  uint in_stack_000000ac;
  string *in_stack_000000b0;
  string *in_stack_000000b8;
  string *in_stack_000000c0;
  SimInfo *in_stack_000000c8;
  RadialDistrFunc *in_stack_000000d0;
  uint i;
  string *in_stack_fffffffffffffd68;
  StaticAnalyser *in_stack_fffffffffffffd70;
  size_type in_stack_fffffffffffffd88;
  vector<double,_std::allocator<double>_> *in_stack_fffffffffffffd90;
  allocator<char> *in_stack_fffffffffffffda0;
  char *in_stack_fffffffffffffda8;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *this_01;
  string local_218 [32];
  stringstream local_1f8 [16];
  ostream local_1e8 [80];
  SimInfo *in_stack_fffffffffffffe68;
  SelectionEvaluator *in_stack_fffffffffffffe70;
  undefined1 local_69 [33];
  uint local_48;
  undefined8 local_30;
  
  local_30 = in_XMM0_Qa;
  RadialDistrFunc::RadialDistrFunc
            (in_stack_000000d0,in_stack_000000c8,in_stack_000000c0,in_stack_000000b8,
             in_stack_000000b0,in_stack_000000ac);
  *in_RDI = &PTR__GofRAngle_0055eb00;
  *(undefined4 *)(in_RDI + 0x1f7) = in_stack_00000008;
  in_RDI[0x1f8] = local_30;
  *(undefined1 *)(in_RDI + 0x1fb) = 0;
  std::__cxx11::string::string((string *)(in_RDI + 0x1fc));
  SelectionManager::SelectionManager(in_stack_00000020,in_stack_00000018);
  SelectionEvaluator::SelectionEvaluator(in_stack_fffffffffffffe70,in_stack_fffffffffffffe68);
  std::
  vector<std::vector<int,_std::allocator<int>_>,_std::allocator<std::vector<int,_std::allocator<int>_>_>_>
  ::vector((vector<std::vector<int,_std::allocator<int>_>,_std::allocator<std::vector<int,_std::allocator<int>_>_>_>
            *)0x14eeac);
  std::
  vector<std::vector<double,_std::allocator<double>_>,_std::allocator<std::vector<double,_std::allocator<double>_>_>_>
  ::vector((vector<std::vector<double,_std::allocator<double>_>,_std::allocator<std::vector<double,_std::allocator<double>_>_>_>
            *)0x14eec2);
  in_RDI[0x1fa] = (double)in_RDI[0x1f8] / (double)*(uint *)((long)in_RDI + 0x34);
  in_RDI[0x1f6] = 2.0 / (double)*(int *)(in_RDI + 0x1f7);
  std::
  vector<std::vector<int,_std::allocator<int>_>,_std::allocator<std::vector<int,_std::allocator<int>_>_>_>
  ::resize((vector<std::vector<int,_std::allocator<int>_>,_std::allocator<std::vector<int,_std::allocator<int>_>_>_>
            *)in_stack_fffffffffffffd90,in_stack_fffffffffffffd88);
  std::
  vector<std::vector<double,_std::allocator<double>_>,_std::allocator<std::vector<double,_std::allocator<double>_>_>_>
  ::resize((vector<std::vector<double,_std::allocator<double>_>,_std::allocator<std::vector<double,_std::allocator<double>_>_>_>
            *)in_stack_fffffffffffffd90,in_stack_fffffffffffffd88);
  for (local_48 = 0; local_48 < *(uint *)((long)in_RDI + 0x34); local_48 = local_48 + 1) {
    std::
    vector<std::vector<int,_std::allocator<int>_>,_std::allocator<std::vector<int,_std::allocator<int>_>_>_>
    ::operator[]((vector<std::vector<int,_std::allocator<int>_>,_std::allocator<std::vector<int,_std::allocator<int>_>_>_>
                  *)(in_RDI + 0x2c3),(ulong)local_48);
    std::vector<int,_std::allocator<int>_>::resize
              ((vector<int,_std::allocator<int>_> *)in_stack_fffffffffffffd90,
               in_stack_fffffffffffffd88);
    std::
    vector<std::vector<double,_std::allocator<double>_>,_std::allocator<std::vector<double,_std::allocator<double>_>_>_>
    ::operator[]((vector<std::vector<double,_std::allocator<double>_>,_std::allocator<std::vector<double,_std::allocator<double>_>_>_>
                  *)(in_RDI + 0x2c6),(ulong)local_48);
    std::vector<double,_std::allocator<double>_>::resize
              (in_stack_fffffffffffffd90,in_stack_fffffffffffffd88);
  }
  this_01 = (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_69;
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>
            (this_01,in_stack_fffffffffffffda8,in_stack_fffffffffffffda0);
  StaticAnalyser::setAnalysisType(in_stack_fffffffffffffd70,in_stack_fffffffffffffd68);
  std::__cxx11::string::~string((string *)(local_69 + 1));
  std::allocator<char>::~allocator((allocator<char> *)local_69);
  std::__cxx11::stringstream::stringstream(local_1f8);
  poVar1 = std::operator<<(local_1e8," nBins = ");
  poVar1 = (ostream *)std::ostream::operator<<(poVar1,*(uint *)((long)in_RDI + 0x34));
  poVar1 = std::operator<<(poVar1,", maxLen = ");
  poVar1 = (ostream *)std::ostream::operator<<(poVar1,(double)in_RDI[0x1f8]);
  poVar1 = std::operator<<(poVar1,", deltaR = ");
  poVar1 = (ostream *)std::ostream::operator<<(poVar1,(double)in_RDI[0x1fa]);
  poVar1 = std::operator<<(poVar1,", nAngleBins = ");
  this_00 = (StaticAnalyser *)std::ostream::operator<<(poVar1,*(int *)(in_RDI + 0x1f7));
  params_00 = (string *)std::operator<<((ostream *)this_00,", deltaCosAngle = ");
  std::ostream::operator<<(params_00,(double)in_RDI[0x1f6]);
  std::__cxx11::stringstream::str();
  StaticAnalyser::setParameterString(this_00,params_00);
  std::__cxx11::string::~string(local_218);
  std::__cxx11::stringstream::~stringstream(local_1f8);
  return;
}

Assistant:

GofRAngle::GofRAngle(SimInfo* info, const std::string& filename,
                       const std::string& sele1, const std::string& sele2,
                       RealType len, int nrbins, int nangleBins) :
      RadialDistrFunc(info, filename, sele1, sele2, nrbins),
      nAngleBins_(nangleBins), len_(len), doSele3_(false), seleMan3_(info),
      evaluator3_(info) {
    deltaR_        = len_ / (double)nBins_;
    deltaCosAngle_ = 2.0 / (double)nAngleBins_;
    histogram_.resize(nBins_);
    avgGofr_.resize(nBins_);
    for (unsigned int i = 0; i < nBins_; ++i) {
      histogram_[i].resize(nAngleBins_);
      avgGofr_[i].resize(nAngleBins_);
    }

    setAnalysisType("Radial Distribution Function");

    std::stringstream params;
    params << " nBins = " << nBins_ << ", maxLen = " << len_
           << ", deltaR = " << deltaR_ << ", nAngleBins = " << nAngleBins_
           << ", deltaCosAngle = " << deltaCosAngle_;
    const std::string paramString = params.str();
    setParameterString(paramString);
  }